

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestFixtureTests.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_778b3::FakeTestStageBuilder::FakeTestStageBuilder(FakeTestStageBuilder *this)

{
  MockArgumentHandler<ut11::detail::TestStep> *pMVar1;
  MockArgumentHandler<> *pMVar2;
  
  (this->super_TestStageBuilder)._vptr_TestStageBuilder =
       (_func_int **)&PTR__FakeTestStageBuilder_0027bcf0;
  pMVar1 = &(this->mockPushGiven).m_argumentHandler;
  *(undefined8 *)&(this->mockPushGiven).m_callbackHandler.super__Function_base._M_functor = 0;
  *(undefined8 *)
   ((long)&(this->mockPushGiven).m_callbackHandler.super__Function_base._M_functor + 8) = 0;
  (this->mockPushGiven).m_callbackHandler.super__Function_base._M_manager = (_Manager_type)0x0;
  (this->mockPushGiven).m_callbackHandler._M_invoker = (_Invoker_type)0x0;
  *(MockArgumentHandler<ut11::detail::TestStep> **)
   ((long)&(this->mockPushGiven).m_argumentHandler.m_arguments.
           super__List_base<std::tuple<ut11::detail::TestStep>,_std::allocator<std::tuple<ut11::detail::TestStep>_>_>
           ._M_impl._M_node.super__List_node_base + 8) = pMVar1;
  (this->mockPushGiven).m_argumentHandler.m_arguments.
  super__List_base<std::tuple<ut11::detail::TestStep>,_std::allocator<std::tuple<ut11::detail::TestStep>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)pMVar1;
  pMVar1 = &(this->mockPushWhen).m_argumentHandler;
  (this->mockPushGiven).m_argumentHandler.m_arguments.
  super__List_base<std::tuple<ut11::detail::TestStep>,_std::allocator<std::tuple<ut11::detail::TestStep>_>_>
  ._M_impl._M_node._M_size = 0;
  *(undefined8 *)
   &(this->mockPushGiven).m_returnHandler.m_returnCallback.super__Function_base._M_functor = 0;
  *(undefined8 *)
   ((long)&(this->mockPushGiven).m_returnHandler.m_returnCallback.super__Function_base._M_functor +
   8) = 0;
  (this->mockPushGiven).m_returnHandler.m_returnCallback.super__Function_base._M_manager =
       (_Manager_type)0x0;
  (this->mockPushGiven).m_returnHandler.m_returnCallback._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->mockPushWhen).m_callbackHandler.super__Function_base._M_functor = 0;
  (this->mockPushWhen).m_callbackHandler._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)((long)&(this->mockPushWhen).m_callbackHandler.super__Function_base._M_functor + 8)
       = 0;
  (this->mockPushWhen).m_callbackHandler.super__Function_base._M_manager = (_Manager_type)0x0;
  *(MockArgumentHandler<ut11::detail::TestStep> **)
   ((long)&(this->mockPushWhen).m_argumentHandler.m_arguments.
           super__List_base<std::tuple<ut11::detail::TestStep>,_std::allocator<std::tuple<ut11::detail::TestStep>_>_>
           ._M_impl._M_node.super__List_node_base + 8) = pMVar1;
  (this->mockPushWhen).m_argumentHandler.m_arguments.
  super__List_base<std::tuple<ut11::detail::TestStep>,_std::allocator<std::tuple<ut11::detail::TestStep>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)pMVar1;
  pMVar1 = &(this->mockPushThen).m_argumentHandler;
  (this->mockPushWhen).m_argumentHandler.m_arguments.
  super__List_base<std::tuple<ut11::detail::TestStep>,_std::allocator<std::tuple<ut11::detail::TestStep>_>_>
  ._M_impl._M_node._M_size = 0;
  *(undefined8 *)
   &(this->mockPushWhen).m_returnHandler.m_returnCallback.super__Function_base._M_functor = 0;
  *(undefined8 *)
   ((long)&(this->mockPushWhen).m_returnHandler.m_returnCallback.super__Function_base._M_functor + 8
   ) = 0;
  (this->mockPushWhen).m_returnHandler.m_returnCallback.super__Function_base._M_manager =
       (_Manager_type)0x0;
  (this->mockPushWhen).m_returnHandler.m_returnCallback._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->mockPushThen).m_callbackHandler.super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->mockPushThen).m_callbackHandler.super__Function_base._M_functor + 8)
       = 0;
  (this->mockPushThen).m_callbackHandler.super__Function_base._M_manager = (_Manager_type)0x0;
  (this->mockPushThen).m_callbackHandler._M_invoker = (_Invoker_type)0x0;
  *(MockArgumentHandler<ut11::detail::TestStep> **)
   ((long)&(this->mockPushThen).m_argumentHandler.m_arguments.
           super__List_base<std::tuple<ut11::detail::TestStep>,_std::allocator<std::tuple<ut11::detail::TestStep>_>_>
           ._M_impl._M_node.super__List_node_base + 8) = pMVar1;
  (this->mockPushThen).m_argumentHandler.m_arguments.
  super__List_base<std::tuple<ut11::detail::TestStep>,_std::allocator<std::tuple<ut11::detail::TestStep>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)pMVar1;
  pMVar1 = &(this->mockPushFinally).m_argumentHandler;
  *(undefined8 *)
   ((long)&(this->mockPushFinally).m_callbackHandler.super__Function_base._M_functor + 8) = 0;
  (this->mockPushFinally).m_callbackHandler.super__Function_base._M_manager = (_Manager_type)0x0;
  (this->mockPushThen).m_returnHandler.m_returnCallback._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->mockPushFinally).m_callbackHandler.super__Function_base._M_functor = 0;
  *(undefined8 *)
   ((long)&(this->mockPushThen).m_returnHandler.m_returnCallback.super__Function_base._M_functor + 8
   ) = 0;
  (this->mockPushThen).m_returnHandler.m_returnCallback.super__Function_base._M_manager =
       (_Manager_type)0x0;
  (this->mockPushFinally).m_callbackHandler._M_invoker = (_Invoker_type)0x0;
  (this->mockPushThen).m_argumentHandler.m_arguments.
  super__List_base<std::tuple<ut11::detail::TestStep>,_std::allocator<std::tuple<ut11::detail::TestStep>_>_>
  ._M_impl._M_node._M_size = 0;
  *(undefined8 *)
   &(this->mockPushThen).m_returnHandler.m_returnCallback.super__Function_base._M_functor = 0;
  *(MockArgumentHandler<ut11::detail::TestStep> **)
   ((long)&(this->mockPushFinally).m_argumentHandler.m_arguments.
           super__List_base<std::tuple<ut11::detail::TestStep>,_std::allocator<std::tuple<ut11::detail::TestStep>_>_>
           ._M_impl._M_node.super__List_node_base + 8) = pMVar1;
  (this->mockPushFinally).m_argumentHandler.m_arguments.
  super__List_base<std::tuple<ut11::detail::TestStep>,_std::allocator<std::tuple<ut11::detail::TestStep>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)pMVar1;
  pMVar2 = &(this->mockBuild).m_argumentHandler;
  *(undefined8 *)((long)&(this->mockBuild).m_callbackHandler.super__Function_base._M_functor + 8) =
       0;
  (this->mockBuild).m_callbackHandler.super__Function_base._M_manager = (_Manager_type)0x0;
  (this->mockPushFinally).m_returnHandler.m_returnCallback._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->mockBuild).m_callbackHandler.super__Function_base._M_functor = 0;
  *(undefined8 *)
   ((long)&(this->mockPushFinally).m_returnHandler.m_returnCallback.super__Function_base._M_functor
   + 8) = 0;
  (this->mockPushFinally).m_returnHandler.m_returnCallback.super__Function_base._M_manager =
       (_Manager_type)0x0;
  (this->mockPushFinally).m_argumentHandler.m_arguments.
  super__List_base<std::tuple<ut11::detail::TestStep>,_std::allocator<std::tuple<ut11::detail::TestStep>_>_>
  ._M_impl._M_node._M_size = 0;
  *(undefined8 *)
   &(this->mockPushFinally).m_returnHandler.m_returnCallback.super__Function_base._M_functor = 0;
  (this->mockBuild).m_callbackHandler._M_invoker = (_Invoker_type)0x0;
  *(MockArgumentHandler<> **)
   ((long)&(this->mockBuild).m_argumentHandler.m_arguments.
           super__List_base<std::tuple<>,_std::allocator<std::tuple<>_>_>._M_impl._M_node.
           super__List_node_base + 8) = pMVar2;
  (this->mockBuild).m_argumentHandler.m_arguments.
  super__List_base<std::tuple<>,_std::allocator<std::tuple<>_>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)pMVar2;
  (this->mockBuild).m_argumentHandler.m_arguments.
  super__List_base<std::tuple<>,_std::allocator<std::tuple<>_>_>._M_impl._M_node._M_size = 0;
  (this->mockBuild).m_returnHandler.m_isReturnCallbackMode = false;
  (this->mockBuild).m_returnHandler.m_returnValue.
  super__Vector_base<std::shared_ptr<ut11::detail::TestStage>,_std::allocator<std::shared_ptr<ut11::detail::TestStage>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mockBuild).m_returnHandler.m_returnValue.
  super__Vector_base<std::shared_ptr<ut11::detail::TestStage>,_std::allocator<std::shared_ptr<ut11::detail::TestStage>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mockBuild).m_returnHandler.m_returnCallback.super__Function_base._M_manager =
       (_Manager_type)0x0;
  (this->mockBuild).m_returnHandler.m_returnCallback._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->mockBuild).m_returnHandler.m_returnCallback.super__Function_base._M_functor
       = 0;
  *(undefined8 *)
   ((long)&(this->mockBuild).m_returnHandler.m_returnCallback.super__Function_base._M_functor + 8) =
       0;
  (this->mockBuild).m_returnHandler.m_returnValue.
  super__Vector_base<std::shared_ptr<ut11::detail::TestStage>,_std::allocator<std::shared_ptr<ut11::detail::TestStage>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

class FakeTestStageBuilder : public ut11::detail::TestStageBuilder
	{
	public:
		virtual ~FakeTestStageBuilder() { }

		MockAction(PushGiven, ut11::detail::TestStep)
		MockAction(PushWhen, ut11::detail::TestStep)
		MockAction(PushThen, ut11::detail::TestStep)
		MockAction(PushFinally, ut11::detail::TestStep)
		MockFunction(std::vector< std::shared_ptr<ut11::detail::TestStage> >, Build)
	};

	class FakeOutput : public ut11::out::Output
	{
	public:
		virtual ~FakeOutput() { }

		MockAction(Begin)
		MockAction(Finish, std::size_t, std::size_t)

		MockAction(BeginFixture, std::string)
		MockAction(EndFixture, std::string)

		MockAction(BeginTest)
		MockAction(EndTest)

		MockAction(BeginGiven, std::string)
		MockAction(EndGiven, std::string)

		MockAction(BeginWhen, std::string)
		MockAction(EndWhen, std::string)

		MockAction(BeginThen, std::string)
		MockAction(EndThen, std::string)

		MockAction(BeginFinally, std::string)
		MockAction(EndFinally, std::string)

		MockAction(OnError, std::size_t, std::string, std::string)
		MockAction(OnUnknownError)

		ut11::Mock<void (std::exception)> mockOnError1;
		virtual void OnError(const std::exception& ex) { mockOnError1(ex); }
	};

	class FakeTestStage : public ut11::detail::TestStage
	{
	private:
		bool m_result;

	public:
		bool WasTestStageRun;

		FakeTestStage(bool result)
			: m_result(result), WasTestStageRun(false)
		{
		}

		virtual ~FakeTestStage() { }


		virtual bool Run(ut11::out::Output&)
		{
			WasTestStageRun = true;
			return m_result;
		}
	};
}

class TestFixtureConstructionTests : public ut11::TestFixture
{
private:
	std::unique_ptr<ut11::TestFixture> m_fixture;
	std::string m_name;

public:
	virtual void Run()
	{
		Given("a fixture constructed with a name", [&]() {

			std::unique_ptr<FakeTestStageBuilder> StageBuilder(new FakeTestStageBuilder);
			m_name = std::string("name");

			m_fixture = std::move(std::unique_ptr<ut11::TestFixture>(new ut11::TestFixture(m_name, std::move(StageBuilder))));
		});
		Then("the name is as expected", [&]() {

			AssertThat(m_fixture->GetName(), ut11::Is::EqualTo(m_name));
		});

		When("setting the name", [&]() {
			m_name = "other_name";
			m_fixture->SetName(m_name);
		});
		Then("the name is as expected", [&]() {

			AssertThat(m_fixture->GetName(), ut11::Is::EqualTo(m_name));
		});
	}